

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
objectLength(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  uint8_t head;
  uint8_t *puVar1;
  ValueLength VVar2;
  unsigned_long length;
  SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *in_RDI;
  ValueLength end;
  ValueLength offsetSize;
  ValueLength end_1;
  uint8_t h;
  ValueLength in_stack_ffffffffffffffd0;
  ValueLength local_8;
  
  head = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::head
                   ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12f517)
  ;
  if (head == '\n') {
    local_8 = 0;
  }
  else if (head == '\x14') {
    puVar1 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12f546);
    VVar2 = readVariableValueLength<false>(puVar1 + 1);
    puVar1 = start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12f560);
    local_8 = readVariableValueLength<true>(puVar1 + (VVar2 - 1));
  }
  else {
    puVar1 = (uint8_t *)indexEntrySize(in_RDI,head);
    if (puVar1 < (uint8_t *)0x8) {
      start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12f59f);
      local_8 = readIntegerNonEmpty<unsigned_long>(puVar1,in_stack_ffffffffffffffd0);
    }
    else {
      start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12f5c5);
      length = readIntegerNonEmpty<unsigned_long>(puVar1,in_stack_ffffffffffffffd0);
      start((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x12f5e4);
      local_8 = readIntegerNonEmpty<unsigned_long>(puVar1,length);
    }
  }
  return local_8;
}

Assistant:

ValueLength objectLength() const {
    auto const h = head();
    VELOCYPACK_ASSERT(type(h) == ValueType::Object);

    if (h == 0x0a) {
      // special case: empty!
      return 0;
    }

    if (h == 0x14) {
      // compact Object
      ValueLength end = readVariableValueLength<false>(start() + 1);
      return readVariableValueLength<true>(start() + end - 1);
    }

    ValueLength const offsetSize = indexEntrySize(h);
    VELOCYPACK_ASSERT(offsetSize > 0);

    if (offsetSize < 8) {
      return readIntegerNonEmpty<ValueLength>(start() + offsetSize + 1,
                                              offsetSize);
    }

    ValueLength end = readIntegerNonEmpty<ValueLength>(start() + 1, offsetSize);
    return readIntegerNonEmpty<ValueLength>(start() + end - offsetSize,
                                            offsetSize);
  }